

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O3

void __thiscall
google::protobuf::FileDescriptorSet::MergeFrom(FileDescriptorSet *this,FileDescriptorSet *from)

{
  int iVar1;
  FileDescriptorProto *from_00;
  void **ppvVar2;
  LogMessage *other;
  FileDescriptorProto *this_00;
  int iVar3;
  long lVar4;
  LogFinisher local_61;
  LogMessage local_60;
  
  if (from == this) {
    internal::LogMessage::LogMessage
              (&local_60,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_25/hyperion-project[P]protobuf/src/google/protobuf/descriptor.pb.cc"
               ,0x378);
    other = internal::LogMessage::operator<<(&local_60,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_61,other);
    internal::LogMessage::~LogMessage(&local_60);
  }
  internal::RepeatedPtrFieldBase::Reserve
            (&(this->file_).super_RepeatedPtrFieldBase,
             (from->file_).super_RepeatedPtrFieldBase.current_size_ +
             (this->file_).super_RepeatedPtrFieldBase.current_size_);
  if (0 < (from->file_).super_RepeatedPtrFieldBase.current_size_) {
    lVar4 = 0;
    do {
      from_00 = (FileDescriptorProto *)(from->file_).super_RepeatedPtrFieldBase.elements_[lVar4];
      iVar1 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
      iVar3 = (this->file_).super_RepeatedPtrFieldBase.allocated_size_;
      if (iVar1 < iVar3) {
        ppvVar2 = (this->file_).super_RepeatedPtrFieldBase.elements_;
        (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        this_00 = (FileDescriptorProto *)ppvVar2[iVar1];
      }
      else {
        if (iVar3 == (this->file_).super_RepeatedPtrFieldBase.total_size_) {
          internal::RepeatedPtrFieldBase::Reserve
                    (&(this->file_).super_RepeatedPtrFieldBase,iVar3 + 1);
          iVar3 = (this->file_).super_RepeatedPtrFieldBase.allocated_size_;
        }
        (this->file_).super_RepeatedPtrFieldBase.allocated_size_ = iVar3 + 1;
        this_00 = internal::GenericTypeHandler<google::protobuf::FileDescriptorProto>::New();
        ppvVar2 = (this->file_).super_RepeatedPtrFieldBase.elements_;
        iVar1 = (this->file_).super_RepeatedPtrFieldBase.current_size_;
        (this->file_).super_RepeatedPtrFieldBase.current_size_ = iVar1 + 1;
        ppvVar2[iVar1] = this_00;
      }
      FileDescriptorProto::MergeFrom(this_00,from_00);
      lVar4 = lVar4 + 1;
    } while (lVar4 < (from->file_).super_RepeatedPtrFieldBase.current_size_);
  }
  UnknownFieldSet::MergeFrom(&this->_unknown_fields_,&from->_unknown_fields_);
  return;
}

Assistant:

void FileDescriptorSet::MergeFrom(const FileDescriptorSet& from) {
  GOOGLE_CHECK_NE(&from, this);
  file_.MergeFrom(from.file_);
  mutable_unknown_fields()->MergeFrom(from.unknown_fields());
}